

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_threads_pthreads.c
# Opt level: O1

int zt_threads_pthreads_start
              (zt_threads_thread *_thread,zt_threads_attr *_attr,_func_void_ptr_void_ptr *start_cb,
              void *args)

{
  int iVar1;
  
  iVar1 = pthread_create((pthread_t *)_thread,(pthread_attr_t *)_attr,(__start_routine *)start_cb,
                         args);
  return -(uint)(iVar1 != 0);
}

Assistant:

int
zt_threads_pthreads_start(zt_threads_thread *_thread, zt_threads_attr *_attr,
                          void * (*start_cb)(void *), void *args) {
    pthread_t      *thread;
    pthread_attr_t *attr;
    int             status;

    thread = (pthread_t *)_thread;
    attr   = (pthread_attr_t *)_attr;

    status = pthread_create(thread, attr, start_cb, args);

    return status ? -1 : 0;
}